

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O1

void prepare_close_job(cio_websocket *websocket,cio_websocket_status_code status_code,
                      uint8_t *reason,size_t reason_length,cio_websocket_write_handler_t handler,
                      void *handler_context,cio_buffered_stream_write_handler_t stream_handler)

{
  cio_response_buffer *pcVar1;
  cio_write_buffer *pcVar2;
  anon_union_16_2_70f96463_for_data *paVar3;
  size_t *psVar4;
  uint16_t uVar5;
  size_t __n;
  size_t sVar6;
  
  uVar5 = cio_htobe16((uint16_t)status_code);
  *(uint16_t *)(websocket->ws_private).close_buffer.buffer = uVar5;
  if (reason == (uint8_t *)0x0) {
    sVar6 = 2;
  }
  else {
    __n = 0x7b;
    if (reason_length < 0x7b) {
      __n = reason_length;
    }
    memcpy((websocket->ws_private).close_buffer.buffer + 2,reason,__n);
    sVar6 = __n + 2;
  }
  pcVar1 = &(websocket->ws_private).close_buffer;
  (websocket->ws_private).close_buffer.wb_head.data.head.q_len = 0;
  (websocket->ws_private).close_buffer.wb_head.data.element.length = 0;
  pcVar2 = &(websocket->ws_private).close_buffer.write_buffer;
  (websocket->ws_private).close_buffer.write_buffer.data.head.q_len =
       (size_t)(websocket->ws_private).close_buffer.buffer;
  (websocket->ws_private).close_buffer.write_buffer.data.element.length = sVar6;
  (websocket->ws_private).close_buffer.write_buffer.next = &pcVar1->wb_head;
  (websocket->ws_private).close_buffer.write_buffer.prev = &pcVar1->wb_head;
  (websocket->ws_private).close_buffer.wb_head.next = pcVar2;
  (websocket->ws_private).close_buffer.wb_head.prev = pcVar2;
  paVar3 = &(websocket->ws_private).close_buffer.wb_head.data;
  (paVar3->head).q_len = (paVar3->head).q_len + 1;
  psVar4 = &(websocket->ws_private).close_buffer.wb_head.data.element.length;
  *psVar4 = *psVar4 + sVar6;
  (websocket->ws_private).write_close_job.wbh = &pcVar1->wb_head;
  (websocket->ws_private).write_close_job.handler = handler;
  (websocket->ws_private).write_close_job.handler_context = handler_context;
  (websocket->ws_private).write_close_job.frame_type = CIO_WEBSOCKET_CLOSE_FRAME;
  (websocket->ws_private).write_close_job.last_frame = true;
  (websocket->ws_private).write_close_job.stream_handler = stream_handler;
  return;
}

Assistant:

static void prepare_close_job(struct cio_websocket *websocket, enum cio_websocket_status_code status_code, const uint8_t *reason, size_t reason_length, cio_websocket_write_handler_t handler, void *handler_context, cio_buffered_stream_write_handler_t stream_handler)
{
	uint16_t ws_status_code = (uint16_t)status_code;
	size_t close_buffer_length = sizeof(ws_status_code);
	ws_status_code = cio_htobe16(ws_status_code);
	memcpy(websocket->ws_private.close_buffer.buffer, &ws_status_code, sizeof(ws_status_code));
	if (reason != NULL) {
		size_t copy_len = CIO_MIN(reason_length, sizeof(websocket->ws_private.close_buffer.buffer) - sizeof(ws_status_code));
		memcpy(websocket->ws_private.close_buffer.buffer + sizeof(ws_status_code), reason, copy_len);
		close_buffer_length += copy_len;
	}

	cio_write_buffer_head_init(&websocket->ws_private.close_buffer.wb_head);
	cio_write_buffer_element_init(&websocket->ws_private.close_buffer.write_buffer, websocket->ws_private.close_buffer.buffer, close_buffer_length);
	cio_write_buffer_queue_tail(&websocket->ws_private.close_buffer.wb_head, &websocket->ws_private.close_buffer.write_buffer);
	websocket->ws_private.write_close_job.wbh = &websocket->ws_private.close_buffer.wb_head;
	websocket->ws_private.write_close_job.handler = handler;
	websocket->ws_private.write_close_job.handler_context = handler_context;
	websocket->ws_private.write_close_job.frame_type = CIO_WEBSOCKET_CLOSE_FRAME;
	websocket->ws_private.write_close_job.last_frame = true;
	websocket->ws_private.write_close_job.stream_handler = stream_handler;
}